

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::solve(MultipleShootingSolver *this)

{
  element_type *peVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int iVar4;
  char *pcVar5;
  
  peVar1 = (this->m_optimizer).
           super___shared_ptr<iDynTree::optimization::Optimizer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    pcVar5 = "No optimizer selected.";
  }
  else {
    iVar4 = (*peVar1->_vptr_Optimizer[5])();
    if ((char)iVar4 == '\0') {
      pcVar5 = "Error when calling the optimizer solve method.";
    }
    else {
      peVar1 = (this->m_optimizer).
               super___shared_ptr<iDynTree::optimization::Optimizer,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      iVar4 = (*peVar1->_vptr_Optimizer[6])
                        (peVar1,&((this->m_transcription).
                                  super___shared_ptr<iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->m_solution);
      if ((char)iVar4 != '\0') {
        peVar2 = (this->m_transcription).
                 super___shared_ptr<iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        peVar2->m_solved = true;
        (peVar2->m_stateGuesses).
        super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        p_Var3 = (peVar2->m_stateGuesses).
                 super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
        (peVar2->m_stateGuesses).
        super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
        peVar2 = (this->m_transcription).
                 super___shared_ptr<iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        (peVar2->m_controlGuesses).
        super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        p_Var3 = (peVar2->m_controlGuesses).
                 super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
        (peVar2->m_controlGuesses).
        super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          return true;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        return true;
      }
      pcVar5 = "Error while retrieving the primal variables from the optimizer.";
    }
  }
  iDynTree::reportError("MultipleShootingSolver","solve",pcVar5);
  return false;
}

Assistant:

bool MultipleShootingSolver::solve()
        {
            if (!m_optimizer){
                reportError("MultipleShootingSolver", "solve", "No optimizer selected.");
                return false;
            }
            if (m_optimizer->solve()){
                if (!(m_optimizer->getPrimalVariables(m_transcription->m_solution))){
                    reportError("MultipleShootingSolver", "solve", "Error while retrieving the primal variables from the optimizer.");
                    return false;
                }
            } else {
                reportError("MultipleShootingSolver", "solve", "Error when calling the optimizer solve method.");
                return false;
            }
            m_transcription->m_solved = true;

            m_transcription->m_stateGuesses = nullptr; //Guesses are used only once
            m_transcription->m_controlGuesses = nullptr;

            return true;
        }